

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void run_static_context_tests(int use_prealloc)

{
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *psVar1;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *psVar2;
  void *__s;
  secp256k1_context *extraout_RAX_03;
  long lVar3;
  void *unaff_RBX;
  uchar *p;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar seed [32];
  int local_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  psVar2 = STATIC_CTX;
  if (secp256k1_context_no_precomp != secp256k1_context_static) goto LAB_0013923d;
  unaff_RBX = (void *)(ulong)(uint)use_prealloc;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0x17;
  uStack_30 = 0;
  local_4c = 0;
  local_48 = *(undefined4 *)&(STATIC_CTX->illegal_callback).fn;
  uStack_44 = *(undefined4 *)((long)&(STATIC_CTX->illegal_callback).fn + 4);
  uStack_40 = *(undefined4 *)&(STATIC_CTX->illegal_callback).data;
  uStack_3c = *(undefined4 *)((long)&(STATIC_CTX->illegal_callback).data + 4);
  if (secp256k1_context_no_precomp == STATIC_CTX) goto LAB_00139242;
  (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
  (psVar2->illegal_callback).data = &local_4c;
  while ((psVar2->ecmult_gen_ctx).built != 0) {
    run_static_context_tests_cold_2();
LAB_0013923d:
    run_static_context_tests_cold_1();
    psVar2 = extraout_RAX;
LAB_00139242:
    (*(psVar2->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
    psVar2 = STATIC_CTX;
  }
  (*(psVar2->illegal_callback).fn)
            ("secp256k1_context_is_proper(ctx)",(psVar2->illegal_callback).data);
  psVar2 = STATIC_CTX;
  (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)CONCAT44(uStack_44,local_48);
  (psVar2->illegal_callback).data = (void *)CONCAT44(uStack_3c,uStack_40);
  if (local_4c != 1) goto LAB_001392d4;
  local_4c = 0;
  local_48 = *(undefined4 *)&(psVar2->illegal_callback).fn;
  uStack_44 = *(undefined4 *)((long)&(psVar2->illegal_callback).fn + 4);
  uStack_40 = *(undefined4 *)&(psVar2->illegal_callback).data;
  uStack_3c = *(undefined4 *)((long)&(psVar2->illegal_callback).data + 4);
  if (secp256k1_context_static == psVar2) goto LAB_001392d9;
  (psVar2->illegal_callback).fn = counting_callback_fn;
  (psVar2->illegal_callback).data = &local_4c;
  while ((psVar2->ecmult_gen_ctx).built != 0) {
    run_static_context_tests_cold_4();
LAB_001392d4:
    run_static_context_tests_cold_3();
    psVar2 = extraout_RAX_00;
LAB_001392d9:
    (*(psVar2->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
    psVar2 = STATIC_CTX;
  }
  (*(psVar2->illegal_callback).fn)
            ("secp256k1_context_is_proper(ctx)",(psVar2->illegal_callback).data);
  psVar2 = STATIC_CTX;
  (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)CONCAT44(uStack_44,local_48);
  (psVar2->illegal_callback).data = (void *)CONCAT44(uStack_3c,uStack_40);
  if (local_4c != 1) goto LAB_00139487;
  if ((int)unaff_RBX != 0) {
    local_4c = 0;
    local_48 = *(undefined4 *)&(psVar2->illegal_callback).fn;
    uStack_44 = *(undefined4 *)((long)&(psVar2->illegal_callback).fn + 4);
    uStack_40 = *(undefined4 *)&(psVar2->illegal_callback).data;
    uStack_3c = *(undefined4 *)((long)&(psVar2->illegal_callback).data + 4);
    if (secp256k1_context_static == psVar2) goto LAB_001394b1;
    (psVar2->illegal_callback).fn = counting_callback_fn;
    (psVar2->illegal_callback).data = &local_4c;
    goto LAB_0013947d;
  }
  local_4c = 0;
  local_48 = *(undefined4 *)&(psVar2->illegal_callback).fn;
  uStack_44 = *(undefined4 *)((long)&(psVar2->illegal_callback).fn + 4);
  uStack_40 = *(undefined4 *)&(psVar2->illegal_callback).data;
  uStack_3c = *(undefined4 *)((long)&(psVar2->illegal_callback).data + 4);
  if (secp256k1_context_static == psVar2) goto LAB_0013948c;
  (psVar2->illegal_callback).fn = counting_callback_fn;
  (psVar2->illegal_callback).data = &local_4c;
LAB_0013936e:
  psVar1 = secp256k1_context_clone(psVar2);
  psVar2 = STATIC_CTX;
  if (psVar1 != (secp256k1_context *)0x0) {
    run_static_context_tests_cold_13();
    psVar2 = extraout_RAX_02;
LAB_001394b1:
    (*(psVar2->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
    psVar2 = STATIC_CTX;
LAB_0013947d:
    if ((psVar2->ecmult_gen_ctx).built != 0) goto code_r0x00139482;
    (*(psVar2->illegal_callback).fn)
              ("secp256k1_context_is_proper(ctx)",(psVar2->illegal_callback).data);
    psVar2 = STATIC_CTX;
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)CONCAT44(uStack_44,local_48)
    ;
    (psVar2->illegal_callback).data = (void *)CONCAT44(uStack_3c,uStack_40);
    if (local_4c == 1) {
      __s = malloc(0xd0);
      if (__s == (void *)0x0) goto LAB_001395b6;
      memset(__s,0x2a,0xd0);
      local_4c = 0;
      local_48 = *(undefined4 *)&(psVar2->illegal_callback).fn;
      uStack_44 = *(undefined4 *)((long)&(psVar2->illegal_callback).fn + 4);
      uStack_40 = *(undefined4 *)&(psVar2->illegal_callback).data;
      uStack_3c = *(undefined4 *)((long)&(psVar2->illegal_callback).data + 4);
      unaff_RBX = __s;
      if (secp256k1_context_static == psVar2) goto LAB_001395bb;
      (psVar2->illegal_callback).fn = counting_callback_fn;
      (psVar2->illegal_callback).data = &local_4c;
    }
    else {
      run_static_context_tests_cold_7();
LAB_001395b6:
      run_static_context_tests_cold_12();
LAB_001395bb:
      (*(psVar2->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
      psVar2 = STATIC_CTX;
    }
    if ((psVar2->ecmult_gen_ctx).built == 0) {
      (*(psVar2->illegal_callback).fn)
                ("secp256k1_context_is_proper(ctx)",(psVar2->illegal_callback).data);
      psVar2 = STATIC_CTX;
      (STATIC_CTX->illegal_callback).fn =
           (_func_void_char_ptr_void_ptr *)CONCAT44(uStack_44,local_48);
      (psVar2->illegal_callback).data = (void *)CONCAT44(uStack_3c,uStack_40);
      if (local_4c != 1) goto LAB_0013968e;
      lVar3 = 0;
      do {
        if (*(char *)((long)unaff_RBX + lVar3) != '*') goto LAB_00139693;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0xd0);
      free(unaff_RBX);
      local_4c = 0;
      local_48 = *(undefined4 *)&(psVar2->illegal_callback).fn;
      uStack_44 = *(undefined4 *)((long)&(psVar2->illegal_callback).fn + 4);
      uStack_40 = *(undefined4 *)&(psVar2->illegal_callback).data;
      uStack_3c = *(undefined4 *)((long)&(psVar2->illegal_callback).data + 4);
      if (secp256k1_context_static == psVar2) goto LAB_00139698;
      (psVar2->illegal_callback).fn = counting_callback_fn;
      (psVar2->illegal_callback).data = &local_4c;
      while( true ) {
        secp256k1_context_preallocated_destroy(psVar2);
        psVar1 = STATIC_CTX;
        (STATIC_CTX->illegal_callback).fn =
             (_func_void_char_ptr_void_ptr *)CONCAT44(uStack_44,local_48);
        (psVar1->illegal_callback).data = (void *)CONCAT44(uStack_3c,uStack_40);
        if (local_4c == 1) break;
        run_static_context_tests_cold_11();
LAB_0013968e:
        run_static_context_tests_cold_9();
LAB_00139693:
        run_static_context_tests_cold_10();
LAB_00139698:
        (*(psVar2->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
        psVar2 = STATIC_CTX;
      }
      goto LAB_00139401;
    }
    run_static_context_tests_cold_8();
    goto LAB_0013956f;
  }
  (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)CONCAT44(uStack_44,local_48);
  (psVar2->illegal_callback).data = (void *)CONCAT44(uStack_3c,uStack_40);
  if (local_4c == 1) {
    local_4c = 0;
    local_48 = *(undefined4 *)&(psVar2->illegal_callback).fn;
    uStack_44 = *(undefined4 *)((long)&(psVar2->illegal_callback).fn + 4);
    uStack_40 = *(undefined4 *)&(psVar2->illegal_callback).data;
    uStack_3c = *(undefined4 *)((long)&(psVar2->illegal_callback).data + 4);
    if (secp256k1_context_static == psVar2) goto LAB_00139574;
    (psVar2->illegal_callback).fn = counting_callback_fn;
    (psVar2->illegal_callback).data = &local_4c;
  }
  else {
LAB_0013956f:
    run_static_context_tests_cold_14();
    psVar2 = extraout_RAX_03;
LAB_00139574:
    (*(psVar2->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
    psVar2 = STATIC_CTX;
  }
  secp256k1_context_destroy(psVar2);
  psVar1 = STATIC_CTX;
  (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)CONCAT44(uStack_44,local_48);
  (psVar1->illegal_callback).data = (void *)CONCAT44(uStack_3c,uStack_40);
  if (local_4c == 1) {
LAB_00139401:
    local_48 = 0;
    if (secp256k1_context_static != psVar1) {
      (psVar1->illegal_callback).fn = counting_callback_fn;
      (psVar1->illegal_callback).data = &local_48;
      goto LAB_00139436;
    }
  }
  else {
    run_static_context_tests_cold_15();
  }
  run_static_context_tests_cold_16();
LAB_00139436:
  run_static_context_tests_cold_17();
  return;
code_r0x00139482:
  run_static_context_tests_cold_6();
LAB_00139487:
  run_static_context_tests_cold_5();
  psVar2 = extraout_RAX_01;
LAB_0013948c:
  (*(psVar2->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar2->illegal_callback).data);
  psVar2 = STATIC_CTX;
  goto LAB_0013936e;
}

Assistant:

static void run_static_context_tests(int use_prealloc) {
    /* Check that deprecated secp256k1_context_no_precomp is an alias to secp256k1_context_static. */
    CHECK(secp256k1_context_no_precomp == secp256k1_context_static);

    {
        unsigned char seed[32] = {0x17};

        /* Randomizing secp256k1_context_static is not supported. */
        CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_randomize(STATIC_CTX, seed));
        CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_randomize(STATIC_CTX, NULL));

        /* Destroying or cloning secp256k1_context_static is not supported. */
        if (use_prealloc) {
            CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_preallocated_clone_size(STATIC_CTX));
            {
                secp256k1_context *my_static_ctx = malloc(sizeof(*STATIC_CTX));
                CHECK(my_static_ctx != NULL);
                memset(my_static_ctx, 0x2a, sizeof(*my_static_ctx));
                CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_preallocated_clone(STATIC_CTX, my_static_ctx));
                CHECK(all_bytes_equal(my_static_ctx, 0x2a, sizeof(*my_static_ctx)));
                free(my_static_ctx);
            }
            CHECK_ILLEGAL_VOID(STATIC_CTX, secp256k1_context_preallocated_destroy(STATIC_CTX));
        } else {
            CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_clone(STATIC_CTX));
            CHECK_ILLEGAL_VOID(STATIC_CTX, secp256k1_context_destroy(STATIC_CTX));
        }
    }

    {
        /* Verify that setting and resetting illegal callback works */
        int32_t dummy = 0;
        secp256k1_context_set_illegal_callback(STATIC_CTX, counting_callback_fn, &dummy);
        CHECK(STATIC_CTX->illegal_callback.fn == counting_callback_fn);
        CHECK(STATIC_CTX->illegal_callback.data == &dummy);
        secp256k1_context_set_illegal_callback(STATIC_CTX, NULL, NULL);
        CHECK(STATIC_CTX->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
        CHECK(STATIC_CTX->illegal_callback.data == NULL);
    }
}